

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots.cpp
# Opt level: O3

void * parseFeatureDict(SymbolContext<char> *ctx)

{
  long lVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this;
  long lVar2;
  Ch *local_48 [2];
  Ch local_38 [16];
  GenericStringStream<rapidjson::UTF8<char>_> local_28;
  
  if (ctx->num_values < 1) {
    this = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)0x0;
  }
  else {
    this = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)operator_new(0x60);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(this,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                      (CrtAllocator *)0x0);
    lVar1 = ctx->symbol->start;
    lVar2 = (long)ctx->context->m_window + lVar1;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,lVar2,((int)ctx->symbol->end - (int)lVar1) + lVar2);
    local_28.src_ = local_48[0];
    local_28.head_ = local_48[0];
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
    ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
              ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                *)this,&local_28);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return this;
}

Assistant:

void *parseFeatureDict(const SymbolContext<char>& ctx)
{
  if (ctx.count() > 0) {
    auto ret = new rapidjson::Document;
    ret->Parse(ctx.read().c_str());
    return ret;
  }
  return nullptr;
}